

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.h
# Opt level: O0

XmlRpcValue * __thiscall XmlRpc::XmlRpcValue::operator=(XmlRpcValue *this,char *rhs)

{
  XmlRpcValue *pXVar1;
  string *in_stack_ffffffffffffffa8;
  XmlRpcValue *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  allocator<char> *in_stack_ffffffffffffffc0;
  XmlRpcValue *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  XmlRpcValue(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pXVar1 = operator=((XmlRpcValue *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ~XmlRpcValue((XmlRpcValue *)0x48c507);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator(&local_41);
  return pXVar1;
}

Assistant:

XmlRpcValue& operator=(const char* rhs) { return operator=(XmlRpcValue(std::string(rhs))); }